

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstrumentPass::InstProcessCallTreeFromRoots
          (InstrumentPass *this,InstProcessFunction *pfn,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots,
          uint32_t stage_idx)

{
  Function *func;
  InstrumentPass *pIVar1;
  int iVar2;
  _Elt_pointer puVar3;
  iterator iVar4;
  byte bVar5;
  _Hash_node_base *p_Var6;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  uint32_t fi;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  done;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_90;
  InstrumentPass *local_88;
  uint32_t local_80;
  uint local_7c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_78;
  InstProcessFunction *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var6 = (this->param2input_func_id_)._M_h._M_before_begin._M_nxt;
  local_88 = this;
  local_80 = stage_idx;
  local_70 = pfn;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_90 = &local_68;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,(undefined1 *)((long)&p_Var6[1]._M_nxt + 4),&local_90);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  p_Var6 = (local_88->param2output_func_id_)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_90 = &local_68;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,(undefined1 *)((long)&p_Var6[1]._M_nxt + 4),&local_90);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  pIVar1 = local_88;
  puVar3 = (roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == puVar3) {
    bVar5 = 0;
  }
  else {
    local_78 = &(local_88->id2function_)._M_h;
    bVar5 = 0;
    do {
      local_7c = *puVar3;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&roots->c);
      local_90 = &local_68;
      pVar7 = std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_68,&local_7c,&local_90);
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        iVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_78,&local_7c);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        func = *(Function **)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>
                       ._M_cur + 0x10);
        IRContext::AddCalls((pIVar1->super_Pass).context_,func,roots);
        iVar2 = (*(pIVar1->super_Pass)._vptr_Pass[5])(pIVar1,func,(ulong)local_80,local_70);
        bVar5 = bVar5 | (byte)iVar2;
      }
      puVar3 = (roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != puVar3);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (bool)(bVar5 & 1);
}

Assistant:

bool InstrumentPass::InstProcessCallTreeFromRoots(InstProcessFunction& pfn,
                                                  std::queue<uint32_t>* roots,
                                                  uint32_t stage_idx) {
  bool modified = false;
  std::unordered_set<uint32_t> done;
  // Don't process input and output functions
  for (auto& ifn : param2input_func_id_) done.insert(ifn.second);
  for (auto& ofn : param2output_func_id_) done.insert(ofn.second);
  // Process all functions from roots
  while (!roots->empty()) {
    const uint32_t fi = roots->front();
    roots->pop();
    if (done.insert(fi).second) {
      Function* fn = id2function_.at(fi);
      // Add calls first so we don't add new output function
      context()->AddCalls(fn, roots);
      modified = InstrumentFunction(fn, stage_idx, pfn) || modified;
    }
  }
  return modified;
}